

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

int aom_satd_sse2(tran_low_t *coeff,int length)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
  for (lVar2 = 0; (int)lVar2 < length; lVar2 = lVar2 + 4) {
    puVar1 = (uint *)(coeff + lVar2);
    uVar7 = (int)*puVar1 >> 0x1f;
    uVar8 = (int)puVar1[1] >> 0x1f;
    uVar9 = (int)puVar1[2] >> 0x1f;
    uVar10 = (int)puVar1[3] >> 0x1f;
    iVar3 = (iVar3 - uVar7) + (uVar7 ^ *puVar1);
    iVar4 = (iVar4 - uVar8) + (uVar8 ^ puVar1[1]);
    iVar5 = (iVar5 - uVar9) + (uVar9 ^ puVar1[2]);
    iVar6 = (iVar6 - uVar10) + (uVar10 ^ puVar1[3]);
  }
  return iVar6 + iVar4 + iVar5 + iVar3;
}

Assistant:

int aom_satd_sse2(const tran_low_t *coeff, int length) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  __m128i accum = zero;

  for (i = 0; i < length; i += 4) {
    const __m128i src_line = _mm_load_si128((const __m128i *)coeff);
    const __m128i coeff_sign = _mm_srai_epi32(src_line, 31);
    const __m128i abs_coeff = invert_sign_32_sse2(src_line, coeff_sign);
    accum = _mm_add_epi32(accum, abs_coeff);
    coeff += 4;
  }

  {  // cascading summation of accum
    __m128i hi = _mm_srli_si128(accum, 8);
    accum = _mm_add_epi32(accum, hi);
    hi = _mm_srli_epi64(accum, 32);
    accum = _mm_add_epi32(accum, hi);
  }

  return _mm_cvtsi128_si32(accum);
}